

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.h
# Opt level: O0

void __thiscall CServiceHash::CServiceHash(CServiceHash *this)

{
  FastRandomContext *this_00;
  uint64_t uVar1;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  FastRandomContext *in_stack_fffffffffffffea8;
  undefined1 fDeterministic;
  FastRandomContext *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 uVar2;
  undefined1 local_90 [136];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = 0;
  fDeterministic = (undefined1)((ulong)local_90 >> 0x38);
  FastRandomContext::FastRandomContext(in_stack_fffffffffffffeb8,(bool)fDeterministic);
  this_00 = (FastRandomContext *)
            FastRandomContext::rand64
                      ((FastRandomContext *)CONCAT44(uVar2,in_stack_fffffffffffffec0));
  FastRandomContext::~FastRandomContext(in_stack_fffffffffffffea8);
  *in_RDI = this_00;
  FastRandomContext::FastRandomContext(this_00,(bool)fDeterministic);
  uVar1 = FastRandomContext::rand64((FastRandomContext *)CONCAT44(uVar2,in_stack_fffffffffffffec0));
  FastRandomContext::~FastRandomContext(in_stack_fffffffffffffea8);
  in_RDI[1] = uVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CServiceHash()
        : m_salt_k0{FastRandomContext().rand64()},
          m_salt_k1{FastRandomContext().rand64()}
    {
    }